

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void LogTextV(ImGuiContext *g,char *fmt,__va_list_tag *args)

{
  int *piVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  
  if (g->LogFile != (ImFileHandle)0x0) {
    iVar5 = (g->LogBuffer).Buf.Capacity;
    if (iVar5 < 0) {
      iVar5 = iVar5 / 2 + iVar5;
      iVar3 = 0;
      if (0 < iVar5) {
        iVar3 = iVar5;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pcVar4 = (char *)(*GImAllocatorAllocFunc)((size_t)iVar3,GImAllocatorUserData);
      pcVar2 = (g->LogBuffer).Buf.Data;
      if (pcVar2 != (char *)0x0) {
        memcpy(pcVar4,pcVar2,(long)(g->LogBuffer).Buf.Size);
        pcVar2 = (g->LogBuffer).Buf.Data;
        if ((pcVar2 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
      }
      (g->LogBuffer).Buf.Data = pcVar4;
      (g->LogBuffer).Buf.Capacity = iVar3;
    }
    (g->LogBuffer).Buf.Size = 0;
    ImGuiTextBuffer::appendfv(&g->LogBuffer,fmt,args);
    pcVar2 = (g->LogBuffer).Buf.Data;
    pcVar4 = ImGuiTextBuffer::EmptyString;
    if (pcVar2 != (char *)0x0) {
      pcVar4 = pcVar2;
    }
    iVar5 = (g->LogBuffer).Buf.Size;
    iVar3 = iVar5 + -1;
    if (iVar5 == 0) {
      iVar3 = 0;
    }
    fwrite(pcVar4,1,(long)iVar3,(FILE *)g->LogFile);
    return;
  }
  ImGuiTextBuffer::appendfv(&g->LogBuffer,fmt,args);
  return;
}

Assistant:

static inline void LogTextV(ImGuiContext& g, const char* fmt, va_list args)
{
    if (g.LogFile)
    {
        g.LogBuffer.Buf.resize(0);
        g.LogBuffer.appendfv(fmt, args);
        ImFileWrite(g.LogBuffer.c_str(), sizeof(char), (ImU64)g.LogBuffer.size(), g.LogFile);
    }
    else
    {
        g.LogBuffer.appendfv(fmt, args);
    }
}